

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O0

void __thiscall Assimp::LWO::Surface::Surface(Surface *this,Surface *param_1)

{
  float fVar1;
  float fVar2;
  float fVar3;
  bool bVar4;
  undefined3 uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Surface *param_1_local;
  Surface *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  aiColor3D::aiColor3D(&this->mColor,&param_1->mColor);
  bVar4 = param_1->bDoubleSided;
  uVar5 = *(undefined3 *)&param_1->field_0x2d;
  fVar6 = param_1->mDiffuseValue;
  fVar7 = param_1->mSpecularValue;
  fVar8 = param_1->mTransparency;
  fVar1 = param_1->mLuminosity;
  fVar2 = param_1->mColorHighlights;
  fVar3 = param_1->mMaximumSmoothAngle;
  this->mGlossiness = param_1->mGlossiness;
  this->mLuminosity = fVar1;
  this->mColorHighlights = fVar2;
  this->mMaximumSmoothAngle = fVar3;
  this->bDoubleSided = bVar4;
  *(undefined3 *)&this->field_0x2d = uVar5;
  this->mDiffuseValue = fVar6;
  this->mSpecularValue = fVar7;
  this->mTransparency = fVar8;
  std::__cxx11::string::string((string *)&this->mVCMap,(string *)&param_1->mVCMap);
  this->mVCMapType = param_1->mVCMapType;
  std::__cxx11::list<Assimp::LWO::Shader,_std::allocator<Assimp::LWO::Shader>_>::list
            (&this->mShaders,&param_1->mShaders);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mColorTextures,&param_1->mColorTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mDiffuseTextures,&param_1->mDiffuseTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mSpecularTextures,&param_1->mSpecularTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mOpacityTextures,&param_1->mOpacityTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mBumpTextures,&param_1->mBumpTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mGlossinessTextures,&param_1->mGlossinessTextures);
  std::__cxx11::list<Assimp::LWO::Texture,_std::allocator<Assimp::LWO::Texture>_>::list
            (&this->mReflectionTextures,&param_1->mReflectionTextures);
  fVar1 = param_1->mBumpIntensity;
  this->mIOR = param_1->mIOR;
  this->mBumpIntensity = fVar1;
  uVar5 = *(undefined3 *)&param_1->field_0x141;
  fVar1 = param_1->mAdditiveTransparency;
  this->mWireframe = param_1->mWireframe;
  *(undefined3 *)&this->field_0x141 = uVar5;
  this->mAdditiveTransparency = fVar1;
  return;
}

Assistant:

Surface()
        : mColor                (0.78431f,0.78431f,0.78431f)
        , bDoubleSided          (false)
        , mDiffuseValue         (1.f)
        , mSpecularValue        (0.f)
        , mTransparency         (0.f)
        , mGlossiness           (0.4f)
        , mLuminosity           (0.f)
        , mColorHighlights      (0.f)
        , mMaximumSmoothAngle   (0.f) // 0 == not specified, no smoothing
        , mVCMap                ("")
        , mVCMapType            (AI_LWO_RGBA)
        , mIOR                  (1.f) // vakuum
        , mBumpIntensity        (1.f)
        , mWireframe            (false)
        , mAdditiveTransparency (0.f)
    {}